

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::call_matcher_list<void_()>::decommission(call_matcher_list<void_()> *this)

{
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar1;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar2;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar3;
  list_elem<trompeloeil::call_matcher_base<void_()>_> *this_00;
  iterator i;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> uStack_28;
  
  get_lock<void>();
  this_00 = (this->super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>
            ).super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next;
  while (this_00 != (list_elem<trompeloeil::call_matcher_base<void_()>_> *)this) {
    plVar1 = this_00->next;
    (*this_00->_vptr_list_elem[2])(this_00);
    list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check(this_00);
    plVar2 = this_00->next;
    plVar3 = this_00->prev;
    plVar2->prev = plVar3;
    plVar3->next = plVar2;
    this_00->next = this_00;
    this_00->prev = this_00;
    list_elem<trompeloeil::call_matcher_base<void_()>_>::invariant_check(this_00);
    this_00 = plVar1;
  }
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void decommission()
    {
      auto lock = get_lock();
      auto iter = this->begin();
      auto const e = this->end();
      while (iter != e)
      {
        auto i = iter++;
        auto &m = *i;
        m.mock_destroyed();
        m.unlink();
      }
    }